

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::HingeLoss::HingeLoss(HingeLoss *this)

{
  HingeLoss *this_local;
  
  ALossLayer::ALossLayer(&this->super_ALossLayer);
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)&PTR_tag_abi_cxx11__001a5b88;
  std::valarray<float>::valarray(&this->lossGrad,1);
  return;
}

Assistant:

HingeLoss() : lossGrad(1) {}